

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O1

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solve3right4update
          (SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *x,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y2,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *b,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *rhs,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *rhs2)

{
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  int iVar1;
  int iVar2;
  int *ridx;
  int *piVar3;
  int *piVar4;
  Tolerances *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  pointer pnVar5;
  int *piVar6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  pointer pnVar8;
  Real a;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps2_00;
  undefined1 auVar9 [96];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps3_00;
  int iVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  pointer pnVar11;
  long lVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  uint *puVar16;
  byte bVar17;
  undefined4 uStack_47c;
  undefined4 uStack_454;
  undefined8 uStack_438;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *__range2;
  undefined4 uStack_424;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *__range2_1;
  undefined4 uStack_3c0;
  int f;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  uint local_330 [28];
  int local_2c0;
  undefined1 local_2bc;
  fpclass_type local_2b8;
  int32_t local_2b4;
  uint local_2b0 [28];
  int local_240;
  undefined1 local_23c;
  fpclass_type local_238;
  int32_t local_234;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  uint local_1b0 [28];
  int local_140;
  undefined1 local_13c;
  fpclass_type local_138;
  int32_t local_134;
  uint local_130 [28];
  int local_c0;
  undefined1 local_bc;
  fpclass_type local_b8;
  int32_t local_b4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar17 = 0;
  uStack_424 = (undefined4)((ulong)b >> 0x20);
  (*this->solveTime->_vptr_Timer[3])();
  ridx = (this->ssvec).super_IdxSet.idx;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  iVar10 = (rhs->super_IdxSet).num;
  rhs->setupStatus = false;
  piVar3 = (rhs->super_IdxSet).idx;
  iVar1 = (rhs2->super_IdxSet).num;
  rhs2->setupStatus = false;
  piVar4 = (rhs2->super_IdxSet).idx;
  this_01 = (this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_02 = (this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_02->_M_use_count = this_02->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_02->_M_use_count = this_02->_M_use_count + 1;
    }
  }
  a = Tolerances::epsilon(this_01);
  epsilon.m_backend.fpclass = cpp_dec_float_finite;
  epsilon.m_backend.prec_elem = 0x1c;
  epsilon.m_backend.data._M_elems[0] = 0;
  epsilon.m_backend.data._M_elems[1] = 0;
  epsilon.m_backend.data._M_elems[2] = 0;
  epsilon.m_backend.data._M_elems[3] = 0;
  epsilon.m_backend.data._M_elems[4] = 0;
  epsilon.m_backend.data._M_elems[5] = 0;
  epsilon.m_backend.data._M_elems[6] = 0;
  epsilon.m_backend.data._M_elems[7] = 0;
  epsilon.m_backend.data._M_elems[8] = 0;
  epsilon.m_backend.data._M_elems[9] = 0;
  epsilon.m_backend.data._M_elems[10] = 0;
  epsilon.m_backend.data._M_elems[0xb] = 0;
  epsilon.m_backend.data._M_elems[0xc] = 0;
  epsilon.m_backend.data._M_elems[0xd] = 0;
  epsilon.m_backend.data._M_elems[0xe] = 0;
  epsilon.m_backend.data._M_elems[0xf] = 0;
  epsilon.m_backend.data._M_elems[0x10] = 0;
  epsilon.m_backend.data._M_elems[0x11] = 0;
  epsilon.m_backend.data._M_elems[0x12] = 0;
  epsilon.m_backend.data._M_elems[0x13] = 0;
  epsilon.m_backend.data._M_elems[0x14] = 0;
  epsilon.m_backend.data._M_elems[0x15] = 0;
  epsilon.m_backend.data._M_elems[0x16] = 0;
  epsilon.m_backend.data._M_elems[0x17] = 0;
  epsilon.m_backend.data._M_elems[0x18] = 0;
  epsilon.m_backend.data._M_elems[0x19] = 0;
  epsilon.m_backend.data._M_elems._104_5_ = 0;
  epsilon.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  epsilon.m_backend.exp = 0;
  epsilon.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&epsilon,a);
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(x);
  pnVar5 = (y->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pnVar11 = (y->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pnVar11 != pnVar5; pnVar11 = pnVar11 + 1
      ) {
    (pnVar11->m_backend).fpclass = cpp_dec_float_finite;
    (pnVar11->m_backend).prec_elem = 0x1c;
    (pnVar11->m_backend).data._M_elems[0] = 0;
    (pnVar11->m_backend).data._M_elems[1] = 0;
    (pnVar11->m_backend).data._M_elems[2] = 0;
    (pnVar11->m_backend).data._M_elems[3] = 0;
    (pnVar11->m_backend).data._M_elems[4] = 0;
    (pnVar11->m_backend).data._M_elems[5] = 0;
    (pnVar11->m_backend).data._M_elems[6] = 0;
    (pnVar11->m_backend).data._M_elems[7] = 0;
    (pnVar11->m_backend).data._M_elems[8] = 0;
    (pnVar11->m_backend).data._M_elems[9] = 0;
    (pnVar11->m_backend).data._M_elems[10] = 0;
    (pnVar11->m_backend).data._M_elems[0xb] = 0;
    (pnVar11->m_backend).data._M_elems[0xc] = 0;
    (pnVar11->m_backend).data._M_elems[0xd] = 0;
    (pnVar11->m_backend).data._M_elems[0xe] = 0;
    (pnVar11->m_backend).data._M_elems[0xf] = 0;
    (pnVar11->m_backend).data._M_elems[0x10] = 0;
    (pnVar11->m_backend).data._M_elems[0x11] = 0;
    (pnVar11->m_backend).data._M_elems[0x12] = 0;
    (pnVar11->m_backend).data._M_elems[0x13] = 0;
    (pnVar11->m_backend).data._M_elems[0x14] = 0;
    (pnVar11->m_backend).data._M_elems[0x15] = 0;
    (pnVar11->m_backend).data._M_elems[0x16] = 0;
    (pnVar11->m_backend).data._M_elems[0x17] = 0;
    (pnVar11->m_backend).data._M_elems[0x18] = 0;
    (pnVar11->m_backend).data._M_elems[0x19] = 0;
    (pnVar11->m_backend).data._M_elems[0x1a] = 0;
    (pnVar11->m_backend).data._M_elems[0x1b] = 0;
    *(undefined8 *)((long)(pnVar11->m_backend).data._M_elems + 0x6d) = 0;
  }
  pnVar5 = (y2->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pnVar11 = (y2->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pnVar11 != pnVar5; pnVar11 = pnVar11 + 1
      ) {
    (pnVar11->m_backend).fpclass = cpp_dec_float_finite;
    (pnVar11->m_backend).prec_elem = 0x1c;
    (pnVar11->m_backend).data._M_elems[0] = 0;
    (pnVar11->m_backend).data._M_elems[1] = 0;
    (pnVar11->m_backend).data._M_elems[2] = 0;
    (pnVar11->m_backend).data._M_elems[3] = 0;
    (pnVar11->m_backend).data._M_elems[4] = 0;
    (pnVar11->m_backend).data._M_elems[5] = 0;
    (pnVar11->m_backend).data._M_elems[6] = 0;
    (pnVar11->m_backend).data._M_elems[7] = 0;
    (pnVar11->m_backend).data._M_elems[8] = 0;
    (pnVar11->m_backend).data._M_elems[9] = 0;
    (pnVar11->m_backend).data._M_elems[10] = 0;
    (pnVar11->m_backend).data._M_elems[0xb] = 0;
    (pnVar11->m_backend).data._M_elems[0xc] = 0;
    (pnVar11->m_backend).data._M_elems[0xd] = 0;
    (pnVar11->m_backend).data._M_elems[0xe] = 0;
    (pnVar11->m_backend).data._M_elems[0xf] = 0;
    (pnVar11->m_backend).data._M_elems[0x10] = 0;
    (pnVar11->m_backend).data._M_elems[0x11] = 0;
    (pnVar11->m_backend).data._M_elems[0x12] = 0;
    (pnVar11->m_backend).data._M_elems[0x13] = 0;
    (pnVar11->m_backend).data._M_elems[0x14] = 0;
    (pnVar11->m_backend).data._M_elems[0x15] = 0;
    (pnVar11->m_backend).data._M_elems[0x16] = 0;
    (pnVar11->m_backend).data._M_elems[0x17] = 0;
    (pnVar11->m_backend).data._M_elems[0x18] = 0;
    (pnVar11->m_backend).data._M_elems[0x19] = 0;
    (pnVar11->m_backend).data._M_elems[0x1a] = 0;
    (pnVar11->m_backend).data._M_elems[0x1b] = 0;
    *(undefined8 *)((long)(pnVar11->m_backend).data._M_elems + 0x6d) = 0;
  }
  this_00 = &this->
             super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  this->usetup = true;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(&this->ssvec);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::
  assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              *)&this->ssvec,b);
  if ((this->
      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).l.updateType == 0) {
    iVar2 = (this->ssvec).super_IdxSet.num;
    pnVar13 = &epsilon;
    pnVar15 = &local_b0;
    for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pnVar15->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar17 * -2 + 1) * 4);
      pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar15 + ((ulong)bVar17 * -2 + 1) * 4);
    }
    local_b0.m_backend.exp = epsilon.m_backend.exp;
    local_b0.m_backend.neg = epsilon.m_backend.neg;
    local_b0.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_b0.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    x->setupStatus = false;
    piVar6 = (x->super_IdxSet).idx;
    pnVar13 = (x->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar15 = (this->ssvec).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar7 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar14 = &epsilon;
    puVar16 = local_130;
    for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar16 = (pnVar14->m_backend).data._M_elems[0];
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
      puVar16 = puVar16 + (ulong)bVar17 * -2 + 1;
    }
    local_c0 = epsilon.m_backend.exp;
    local_bc = epsilon.m_backend.neg;
    local_b8 = epsilon.m_backend.fpclass;
    local_b4 = epsilon.m_backend.prec_elem;
    rhs->setupStatus = false;
    pnVar11 = (y2->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar5 = (rhs->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar14 = &epsilon;
    puVar16 = local_1b0;
    for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar16 = (pnVar14->m_backend).data._M_elems[0];
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
      puVar16 = puVar16 + (ulong)bVar17 * -2 + 1;
    }
    local_140 = epsilon.m_backend.exp;
    local_13c = epsilon.m_backend.neg;
    local_138 = epsilon.m_backend.fpclass;
    local_134 = epsilon.m_backend.prec_elem;
    rhs2->setupStatus = false;
    auVar9 = ZEXT7296(CONCAT468(uStack_454,
                                CONCAT464(iVar1,CONCAT856(piVar4,CONCAT848((rhs2->
                                                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  ).val.
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  CONCAT840(local_1b0,
                                                            CONCAT832(pnVar11,CONCAT428(uStack_47c,
                                                                                        CONCAT424(
                                                  iVar10,CONCAT816(piVar3,CONCAT88(pnVar5,local_130)
                                                                  ))))))))));
    eps2_00.m_backend.data._M_elems._96_8_ = uStack_438;
    eps2_00.m_backend.data._M_elems[0] = auVar9._0_4_;
    eps2_00.m_backend.data._M_elems[1] = auVar9._4_4_;
    eps2_00.m_backend.data._M_elems[2] = auVar9._8_4_;
    eps2_00.m_backend.data._M_elems[3] = auVar9._12_4_;
    eps2_00.m_backend.data._M_elems[4] = auVar9._16_4_;
    eps2_00.m_backend.data._M_elems[5] = auVar9._20_4_;
    eps2_00.m_backend.data._M_elems[6] = auVar9._24_4_;
    eps2_00.m_backend.data._M_elems[7] = auVar9._28_4_;
    eps2_00.m_backend.data._M_elems[8] = auVar9._32_4_;
    eps2_00.m_backend.data._M_elems[9] = auVar9._36_4_;
    eps2_00.m_backend.data._M_elems[10] = auVar9._40_4_;
    eps2_00.m_backend.data._M_elems[0xb] = auVar9._44_4_;
    eps2_00.m_backend.data._M_elems[0xc] = auVar9._48_4_;
    eps2_00.m_backend.data._M_elems[0xd] = auVar9._52_4_;
    eps2_00.m_backend.data._M_elems[0xe] = auVar9._56_4_;
    eps2_00.m_backend.data._M_elems[0xf] = auVar9._60_4_;
    eps2_00.m_backend.data._M_elems[0x10] = auVar9._64_4_;
    eps2_00.m_backend.data._M_elems[0x11] = auVar9._68_4_;
    eps2_00.m_backend.data._M_elems[0x12] = auVar9._72_4_;
    eps2_00.m_backend.data._M_elems[0x13] = auVar9._76_4_;
    eps2_00.m_backend.data._M_elems[0x14] = auVar9._80_4_;
    eps2_00.m_backend.data._M_elems[0x15] = auVar9._84_4_;
    eps2_00.m_backend.data._M_elems[0x16] = auVar9._88_4_;
    eps2_00.m_backend.data._M_elems[0x17] = auVar9._92_4_;
    eps2_00.m_backend.data._M_elems._104_8_ = pnVar7;
    eps2_00.m_backend.exp = iVar2;
    eps2_00.m_backend._116_4_ = uStack_424;
    eps2_00.m_backend._120_8_ = y2;
    eps3_00.m_backend.data._M_elems._8_8_ = piVar4;
    eps3_00.m_backend.data._M_elems._0_8_ = this_00;
    eps3_00.m_backend.data._M_elems[4] = iVar10;
    eps3_00.m_backend.data._M_elems[5] = 0;
    eps3_00.m_backend.data._M_elems._24_8_ = x;
    eps3_00.m_backend.data._M_elems[8] = iVar1;
    eps3_00.m_backend.data._M_elems[9] = 0;
    eps3_00.m_backend.data._M_elems._40_8_ = ridx;
    eps3_00.m_backend.data._M_elems._48_8_ = piVar3;
    eps3_00.m_backend.data._M_elems[0xe] = uStack_3c0;
    eps3_00.m_backend.data._M_elems[0xf] = f;
    eps3_00.m_backend.data._M_elems[0x10] = epsilon.m_backend.data._M_elems[0];
    eps3_00.m_backend.data._M_elems[0x11] = epsilon.m_backend.data._M_elems[1];
    eps3_00.m_backend.data._M_elems[0x12] = epsilon.m_backend.data._M_elems[2];
    eps3_00.m_backend.data._M_elems[0x13] = epsilon.m_backend.data._M_elems[3];
    eps3_00.m_backend.data._M_elems[0x14] = epsilon.m_backend.data._M_elems[4];
    eps3_00.m_backend.data._M_elems[0x15] = epsilon.m_backend.data._M_elems[5];
    eps3_00.m_backend.data._M_elems[0x16] = epsilon.m_backend.data._M_elems[6];
    eps3_00.m_backend.data._M_elems[0x17] = epsilon.m_backend.data._M_elems[7];
    eps3_00.m_backend.data._M_elems[0x18] = epsilon.m_backend.data._M_elems[8];
    eps3_00.m_backend.data._M_elems[0x19] = epsilon.m_backend.data._M_elems[9];
    eps3_00.m_backend.data._M_elems[0x1a] = epsilon.m_backend.data._M_elems[10];
    eps3_00.m_backend.data._M_elems[0x1b] = epsilon.m_backend.data._M_elems[0xb];
    eps3_00.m_backend._112_8_ = epsilon.m_backend.data._M_elems._48_8_;
    eps3_00.m_backend.fpclass = epsilon.m_backend.data._M_elems[0xe];
    eps3_00.m_backend.prec_elem = epsilon.m_backend.data._M_elems[0xf];
    iVar10 = CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::vSolveRight4update3
                       (this_00,&local_b0,pnVar13,piVar6,pnVar15,ridx,iVar2,pnVar7,eps2_00,pnVar15,
                        (int *)pnVar13,(int)piVar6,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)rhs,eps3_00,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)epsilon.m_backend.data._M_elems._64_8_,
                        (int *)epsilon.m_backend.data._M_elems._72_8_,
                        epsilon.m_backend.data._M_elems[0x14],
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)epsilon.m_backend.data._M_elems._88_8_,
                        (int *)epsilon.m_backend.data._M_elems._96_8_,
                        (int *)CONCAT35(epsilon.m_backend.data._M_elems[0x1b]._1_3_,
                                        epsilon.m_backend.data._M_elems._104_5_));
    x->setupStatus = false;
    (x->super_IdxSet).num = iVar10;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::
    setup_and_assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)&this->eta,x);
  }
  else {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear(&this->forest);
    iVar2 = (this->ssvec).super_IdxSet.num;
    pnVar13 = &epsilon;
    pnVar15 = &local_230;
    for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pnVar15->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar17 * -2 + 1) * 4);
      pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar15 + ((ulong)bVar17 * -2 + 1) * 4);
    }
    local_230.m_backend.exp = epsilon.m_backend.exp;
    local_230.m_backend.neg = epsilon.m_backend.neg;
    local_230.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_230.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    x->setupStatus = false;
    piVar6 = (x->super_IdxSet).idx;
    pnVar13 = (x->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar15 = (this->ssvec).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar7 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar14 = &epsilon;
    puVar16 = local_2b0;
    for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar16 = (pnVar14->m_backend).data._M_elems[0];
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
      puVar16 = puVar16 + (ulong)bVar17 * -2 + 1;
    }
    local_240 = epsilon.m_backend.exp;
    local_23c = epsilon.m_backend.neg;
    local_238 = epsilon.m_backend.fpclass;
    local_234 = epsilon.m_backend.prec_elem;
    rhs->setupStatus = false;
    pnVar11 = (y2->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar5 = (rhs->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar14 = &epsilon;
    puVar16 = local_330;
    for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar16 = (pnVar14->m_backend).data._M_elems[0];
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
      puVar16 = puVar16 + (ulong)bVar17 * -2 + 1;
    }
    local_2c0 = epsilon.m_backend.exp;
    local_2bc = epsilon.m_backend.neg;
    local_2b8 = epsilon.m_backend.fpclass;
    local_2b4 = epsilon.m_backend.prec_elem;
    rhs2->setupStatus = false;
    pnVar8 = (rhs2->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (this->forest).setupStatus = false;
    eps2.m_backend.data._M_elems._8_8_ = pnVar5;
    eps2.m_backend.data._M_elems._0_8_ = local_2b0;
    eps2.m_backend.data._M_elems._16_8_ = piVar3;
    eps2.m_backend.data._M_elems[6] = iVar10;
    eps2.m_backend.data._M_elems[7] = 0;
    eps2.m_backend.data._M_elems._32_8_ = pnVar11;
    eps2.m_backend.data._M_elems._40_8_ = local_330;
    eps2.m_backend.data._M_elems._48_8_ = pnVar8;
    eps2.m_backend.data._M_elems._56_8_ = piVar4;
    eps2.m_backend.data._M_elems[0x10] = iVar1;
    eps2.m_backend.data._M_elems[0x11] = 0;
    eps2.m_backend.data._M_elems._72_8_ =
         (this->forest).
         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    eps2.m_backend.data._M_elems._80_8_ = &f;
    eps2.m_backend.data._M_elems._88_8_ = (this->forest).super_IdxSet.idx;
    eps2.m_backend.data._M_elems._96_8_ = uStack_438;
    eps2.m_backend.data._M_elems._104_8_ = pnVar7;
    eps2.m_backend.exp = iVar2;
    eps2.m_backend._116_4_ = 0;
    eps2.m_backend._120_8_ = pnVar5;
    eps3.m_backend.data._M_elems._8_8_ = piVar4;
    eps3.m_backend.data._M_elems._0_8_ = this_00;
    eps3.m_backend.data._M_elems[4] = iVar10;
    eps3.m_backend.data._M_elems[5] = 0;
    eps3.m_backend.data._M_elems._24_8_ = x;
    eps3.m_backend.data._M_elems[8] = iVar1;
    eps3.m_backend.data._M_elems[9] = 0;
    eps3.m_backend.data._M_elems._40_8_ = ridx;
    eps3.m_backend.data._M_elems._48_8_ = piVar3;
    eps3.m_backend.data._M_elems[0xe] = uStack_3c0;
    eps3.m_backend.data._M_elems[0xf] = f;
    eps3.m_backend.data._M_elems[0x10] = epsilon.m_backend.data._M_elems[0];
    eps3.m_backend.data._M_elems[0x11] = epsilon.m_backend.data._M_elems[1];
    eps3.m_backend.data._M_elems[0x12] = epsilon.m_backend.data._M_elems[2];
    eps3.m_backend.data._M_elems[0x13] = epsilon.m_backend.data._M_elems[3];
    eps3.m_backend.data._M_elems[0x14] = epsilon.m_backend.data._M_elems[4];
    eps3.m_backend.data._M_elems[0x15] = epsilon.m_backend.data._M_elems[5];
    eps3.m_backend.data._M_elems[0x16] = epsilon.m_backend.data._M_elems[6];
    eps3.m_backend.data._M_elems[0x17] = epsilon.m_backend.data._M_elems[7];
    eps3.m_backend.data._M_elems[0x18] = epsilon.m_backend.data._M_elems[8];
    eps3.m_backend.data._M_elems[0x19] = epsilon.m_backend.data._M_elems[9];
    eps3.m_backend.data._M_elems[0x1a] = epsilon.m_backend.data._M_elems[10];
    eps3.m_backend.data._M_elems[0x1b] = epsilon.m_backend.data._M_elems[0xb];
    eps3.m_backend._112_8_ = epsilon.m_backend.data._M_elems._48_8_;
    eps3.m_backend.fpclass = epsilon.m_backend.data._M_elems[0xe];
    eps3.m_backend.prec_elem = epsilon.m_backend.data._M_elems[0xf];
    iVar10 = CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::vSolveRight4update3
                       (this_00,&local_230,pnVar13,piVar6,pnVar15,ridx,iVar2,pnVar7,eps2,pnVar15,
                        piVar6,(int)pnVar11,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)rhs,eps3,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)epsilon.m_backend.data._M_elems._64_8_,
                        (int *)epsilon.m_backend.data._M_elems._72_8_,
                        epsilon.m_backend.data._M_elems[0x14],
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)epsilon.m_backend.data._M_elems._88_8_,
                        (int *)epsilon.m_backend.data._M_elems._96_8_,
                        (int *)CONCAT35(epsilon.m_backend.data._M_elems[0x1b]._1_3_,
                                        epsilon.m_backend.data._M_elems._104_5_));
    (x->super_IdxSet).num = iVar10;
    x->setupStatus = true;
    (this->forest).super_IdxSet.num = f;
    (this->forest).setupStatus = true;
  }
  rhs->setupStatus = true;
  rhs2->setupStatus = true;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 3;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solve3right4update(
   SSVectorBase<R>&       x,
   VectorBase<R>&        y,
   VectorBase<R>&        y2,
   const SVectorBase<R>& b,
   SSVectorBase<R>&       rhs,
   SSVectorBase<R>&       rhs2)
{

   solveTime->start();

   int  m;
   int  n;
   int  f;
   int* sidx = ssvec.altIndexMem();
   ssvec.setSize(0);
   ssvec.forceSetup();
   int  rsize = rhs.size();
   int* ridx = rhs.altIndexMem();
   int  rsize2 = rhs2.size();
   int* ridx2 = rhs2.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   y2.clear();
   usetup = true;
   ssvec = b;

   if(this->l.updateType == ETA)
   {
      n = ssvec.size();
      m = this->vSolveRight4update3(epsilon,
                                    x.altValues(), x.altIndexMem(), ssvec.get_ptr(), sidx, n,
                                    y.get_ptr(), epsilon, rhs.altValues(), ridx, rsize,
                                    y2.get_ptr(), epsilon, rhs2.altValues(), ridx2, rsize2,
                                    nullptr, nullptr, nullptr);
      x.setSize(m);
      //      x.forceSetup();
      x.unSetup();
      eta.setup_and_assign(x);
   }
   else
   {
      forest.clear();
      n = ssvec.size();
      m = this->vSolveRight4update3(epsilon,
                                    x.altValues(), x.altIndexMem(), ssvec.get_ptr(), sidx, n,
                                    y.get_ptr(), epsilon, rhs.altValues(), ridx, rsize,
                                    y2.get_ptr(), epsilon, rhs2.altValues(), ridx2, rsize2,
                                    forest.altValues(), &f, forest.altIndexMem());
      x.setSize(m);
      x.forceSetup();
      forest.setSize(f);
      forest.forceSetup();
   }

   rhs.forceSetup();
   rhs2.forceSetup();
   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 3;
   solveTime->stop();
}